

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_bench.cc
# Opt level: O2

void str_gen(char *s,int len)

{
  ulong uVar1;
  
  if (0 < len) {
    for (uVar1 = 0; (uint)len != uVar1; uVar1 = uVar1 + 1) {
      s[uVar1] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[uVar1 % 0x3e];
    }
    s[(ulong)(uint)len - 1] = '\0';
  }
  return;
}

Assistant:

void str_gen(char *s, const int len) {

    int i = 0;
    static const char alphanum[] =
        "0123456789"
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "abcdefghijklmnopqrstuvwxyz";
    size_t n_ch = strlen(alphanum);

    if (len < 1){
        return;
    }

    // return same ordering of chars
    while (i < len) {
        s[i] = alphanum[i%n_ch];
        i++;
    }
    s[len-1] = '\0';
}